

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<std::pair<long,_long>_>::Resize
          (TPZVec<std::pair<long,_long>_> *this,int64_t newsize,pair<long,_long> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  pair<long,_long> *__s;
  long lVar5;
  long lVar6;
  long lVar7;
  pair<long,_long> *ppVar8;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      __s = (pair<long,_long> *)0x0;
    }
    else {
      __s = (pair<long,_long> *)operator_new__(-(ulong)((ulong)newsize >> 0x3c != 0) | newsize << 4)
      ;
      memset(__s,0,newsize << 4);
    }
    if (newsize <= lVar7) {
      lVar7 = newsize;
    }
    if (lVar7 < 1) {
      lVar7 = 0;
    }
    else {
      ppVar8 = this->fStore;
      lVar5 = 0;
      lVar6 = lVar7;
      do {
        puVar1 = (undefined8 *)((long)&ppVar8->first + lVar5);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&__s->first + lVar5);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        lVar5 = lVar5 + 0x10;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    lVar6 = newsize - lVar7;
    if (lVar6 != 0 && lVar7 <= newsize) {
      lVar5 = object->first;
      lVar4 = object->second;
      ppVar8 = __s + lVar7;
      do {
        ppVar8->first = lVar5;
        ppVar8->second = lVar4;
        ppVar8 = ppVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    if (this->fStore != (pair<long,_long> *)0x0) {
      operator_delete__(this->fStore);
    }
    this->fStore = __s;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}